

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O1

U32 duckdb_zstd::ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  uVar3 = (ulong)litLength;
  iVar6 = 0;
  do {
    uVar2 = (uint)uVar3;
    if (optPtr->priceType == zop_predef) {
      uVar2 = uVar2 + 1;
      iVar5 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      if (optLevel == 0) {
        iVar5 = iVar5 << 8;
      }
      else {
        iVar5 = (uVar2 * 0x100 >> ((byte)iVar5 & 0x1f)) + iVar5 * 0x100;
      }
LAB_00387963:
      return iVar5 + iVar6;
    }
    if (uVar2 != 0x20000) {
      if (uVar2 < 0x40) {
        uVar2 = (uint)(byte)ZSTD_LLcode(unsigned_int)::LL_Code[uVar3];
      }
      else {
        uVar1 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        uVar2 = (uVar1 ^ 0xffffffe0) + 0x33;
      }
      uVar4 = optPtr->litLengthFreq[uVar2] + 1;
      uVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (optLevel == 0) {
        iVar5 = (uVar1 ^ 0x1f) * 0x100 + -0x1f00;
      }
      else {
        iVar5 = -((uVar4 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100);
      }
      iVar5 = (uint)(byte)LL_bits[uVar2] * 0x100 + optPtr->litLengthSumBasePrice + iVar5;
      goto LAB_00387963;
    }
    iVar6 = iVar6 + 0x100;
    uVar3 = 0x1ffff;
  } while( true );
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    assert(litLength <= ZSTD_BLOCKSIZE_MAX);
    if (optPtr->priceType == zop_predef)
        return WEIGHT(litLength, optLevel);

    /* ZSTD_LLcode() can't compute litLength price for sizes >= ZSTD_BLOCKSIZE_MAX
     * because it isn't representable in the zstd format.
     * So instead just pretend it would cost 1 bit more than ZSTD_BLOCKSIZE_MAX - 1.
     * In such a case, the block would be all literals.
     */
    if (litLength == ZSTD_BLOCKSIZE_MAX)
        return BITCOST_MULTIPLIER + ZSTD_litLengthPrice(ZSTD_BLOCKSIZE_MAX - 1, optPtr, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}